

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

int setenv(char *__name,char *__value,int __replace)

{
  bool bVar1;
  int iVar2;
  stCoRoutine_t *psVar3;
  void *pvVar4;
  char *pcVar5;
  stCoSysEnvArr_t *psVar6;
  stCoSysEnv_t name;
  char *local_30;
  undefined8 local_28;
  
  psVar6 = (stCoSysEnvArr_t *)__name;
  if (g_sys_setenv_func == (setenv_pfn_t)0x0) {
    psVar6 = (stCoSysEnvArr_t *)0xffffffffffffffff;
    g_sys_setenv_func = (setenv_pfn_t)dlsym(0xffffffffffffffff,"setenv");
  }
  bVar1 = co_is_enable_sys_hook();
  if ((bVar1 && _ZL11g_co_sysenv_0 != 0) && (psVar3 = co_self(), psVar3 != (stCoRoutine_t *)0x0)) {
    if (psVar3->pvEnv == (void *)0x0) {
      psVar6 = dup_co_sysenv_arr(psVar6);
      psVar3->pvEnv = psVar6;
    }
    local_28 = 0;
    local_30 = __name;
    pvVar4 = bsearch(&local_30,*psVar3->pvEnv,*(size_t *)((long)psVar3->pvEnv + 8),0x10,
                     co_sysenv_comp);
    if (pvVar4 != (void *)0x0) {
      if ((__replace != 0) || (*(long *)((long)pvVar4 + 8) == 0)) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
        }
        pcVar5 = strdup(__value);
        *(char **)((long)pvVar4 + 8) = pcVar5;
      }
      return 0;
    }
  }
  iVar2 = (*g_sys_setenv_func)(__name,__value,__replace);
  return iVar2;
}

Assistant:

int setenv(const char *n, const char *value, int overwrite)
{
	HOOK_SYS_FUNC( setenv )
	if( co_is_enable_sys_hook() && g_co_sysenv.data )
	{
		stCoRoutine_t *self = co_self();
		if( self )
		{
			if( !self->pvEnv )
			{
				self->pvEnv = dup_co_sysenv_arr( &g_co_sysenv );
			}
			stCoSysEnvArr_t *arr = (stCoSysEnvArr_t*)(self->pvEnv);

			stCoSysEnv_t name = { (char*)n,0 };

			stCoSysEnv_t *e = (stCoSysEnv_t*)bsearch( &name,arr->data,arr->cnt,sizeof(name),co_sysenv_comp );

			if( e )
			{
				if( overwrite || !e->value  )
				{
					if( e->value ) free( e->value );
					e->value = ( value ? strdup( value ) : 0 );
				}
				return 0;
			}
		}

	}
	return g_sys_setenv_func( n,value,overwrite );
}